

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.cpp
# Opt level: O3

int skiwi::is_number(int *is_real,int *is_scientific,char *value)

{
  long lVar1;
  char *pcVar2;
  byte bVar3;
  
  bVar3 = *value;
  lVar1 = 0;
  if (bVar3 < 0x2d) {
    if (bVar3 == 0) {
      return 0;
    }
    if (bVar3 != 0x2b) goto LAB_00253bcd;
  }
  else {
    if (bVar3 == 0x65) {
      return 0;
    }
    if (bVar3 == 0x45) {
      return 0;
    }
    if (bVar3 != 0x2d) goto LAB_00253bcd;
  }
  lVar1 = 1;
  if (value[1] == '\0') {
    return 0;
  }
LAB_00253bcd:
  *is_real = 0;
  *is_scientific = 0;
  bVar3 = value[lVar1];
  if (bVar3 != 0) {
    pcVar2 = value + lVar1;
    do {
      if (bVar3 - 0x3a < 0xfffffff6) {
        if ((bVar3 == 0x65) || (bVar3 == 0x45)) {
          if (*is_scientific != 0) {
            return 0;
          }
          *is_scientific = 1;
          *is_real = 1;
          bVar3 = pcVar2[1];
          if ((bVar3 == 0x2b) || (bVar3 == 0x2d)) {
            bVar3 = pcVar2[2];
            pcVar2 = pcVar2 + 1;
          }
          else if (bVar3 == 0) {
            return (uint)bVar3;
          }
          if (bVar3 == 0) {
            return 0;
          }
        }
        else {
          if (bVar3 != 0x2e) {
            return 0;
          }
          if (*is_real != 0) {
            return 0;
          }
          if (*is_scientific != 0) {
            return 0;
          }
          *is_real = 1;
        }
      }
      bVar3 = pcVar2[1];
      pcVar2 = pcVar2 + 1;
    } while (bVar3 != 0);
  }
  return 1;
}

Assistant:

int is_number(int* is_real, int* is_scientific, const char* value)
  {
  if (value[0] == '\0')
    return 0;
  int i = 0;
  if (value[0] == 'e' || value[0] == 'E')
    return 0;
  if (value[0] == '-' || value[0] == '+')
    {
    ++i;
    if (value[1] == '\0')
      return 0;
    }
  *is_real = 0;
  *is_scientific = 0;
  const char* s = value + i;
  while (*s != '\0')
    {
    if (isdigit((unsigned char)(*s)) == 0)
      {
      if ((*s == '.') && (*is_real == 0) && (*is_scientific == 0))
        *is_real = 1;
      else if ((*s == 'e' || *s == 'E') && (*is_scientific == 0))
        {
        *is_scientific = 1;
        *is_real = 1;
        if (*(s + 1) == '\0')
          return 0;
        if (*(s + 1) == '-' || *(s + 1) == '+')
          {
          ++s;
          }
        if (*(s + 1) == '\0')
          return 0;
        }
      else
        return 0;
      }
    ++s;
    }
  return 1;
  }